

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipField(ParserImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  string field_name;
  string local_a8;
  string local_88;
  string local_68;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"[","");
  bVar3 = TryConsume(this,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    bVar3 = ConsumeTypeUrlOrFullTypeName(this,&local_68);
    if (bVar3) {
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"]","");
      bVar3 = ConsumeBeforeWhitespace(this,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (bVar3) goto LAB_00ffcdf8;
    }
  }
  else {
    bVar3 = ConsumeIdentifierBeforeWhitespace(this,&local_68);
    if (bVar3) {
LAB_00ffcdf8:
      TryConsumeWhitespace(this);
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,":","");
      bVar3 = TryConsumeBeforeWhitespace(this,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (bVar3) {
        TryConsumeWhitespace(this);
        local_a8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"{","");
        sVar2 = (this->tokenizer_).current_.text._M_string_length;
        if (sVar2 == local_a8._M_string_length) {
          if (sVar2 == 0) {
            bVar3 = true;
          }
          else {
            iVar4 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_a8._M_dataplus._M_p
                         ,sVar2);
            bVar3 = iVar4 == 0;
          }
        }
        else {
          bVar3 = false;
        }
        if (bVar3) {
LAB_00ffcea0:
          bVar5 = false;
        }
        else {
          local_48 = local_38;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"<","");
          sVar2 = (this->tokenizer_).current_.text._M_string_length;
          bVar5 = true;
          if (sVar2 == local_40) {
            if (sVar2 == 0) goto LAB_00ffcea0;
            iVar4 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_48,sVar2);
            bVar5 = iVar4 != 0;
          }
        }
        if ((!bVar3) && (local_48 != local_38)) {
          operator_delete(local_48,local_38[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if (bVar5) {
          bVar3 = SkipFieldValue(this);
        }
        else {
          bVar3 = SkipFieldMessage(this);
        }
      }
      else {
        bVar3 = SkipFieldMessage(this);
      }
      if (bVar3 != false) {
        local_a8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,";","");
        bVar3 = TryConsume(this,&local_a8);
        if (!bVar3) {
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,",","");
          TryConsume(this,&local_88);
          if ((!bVar3) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2)) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        bVar3 = true;
        goto LAB_00ffcfd3;
      }
    }
  }
  bVar3 = false;
LAB_00ffcfd3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

bool SkipField() {
    std::string field_name;
    if (TryConsume("[")) {
      // Extension name or type URL.
      DO(ConsumeTypeUrlOrFullTypeName(&field_name));
      DO(ConsumeBeforeWhitespace("]"));
    } else {
      DO(ConsumeIdentifierBeforeWhitespace(&field_name));
    }
    TryConsumeWhitespace();

    // Try to guess the type of this field.
    // If this field is not a message, there should be a ":" between the
    // field name and the field value and also the field value should not
    // start with "{" or "<" which indicates the beginning of a message body.
    // If there is no ":" or there is a "{" or "<" after ":", this field has
    // to be a message or the input is ill-formed.
    if (TryConsumeBeforeWhitespace(":")) {
      TryConsumeWhitespace();
      if (!LookingAt("{") && !LookingAt("<")) {
        DO(SkipFieldValue());
      } else {
        DO(SkipFieldMessage());
      }
    } else {
      DO(SkipFieldMessage());
    }
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");
    return true;
  }